

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O2

void __thiscall gui::Slider::setValue(Slider *this,float value)

{
  float funcArgs_1;
  float fVar1;
  
  fVar1 = (this->range_).first;
  funcArgs_1 = (this->range_).second;
  if (fVar1 <= value) {
    fVar1 = value;
  }
  if (fVar1 <= funcArgs_1) {
    funcArgs_1 = fVar1;
  }
  if ((funcArgs_1 == this->value_) && (!NAN(funcArgs_1) && !NAN(this->value_))) {
    return;
  }
  this->value_ = funcArgs_1;
  Signal<gui::Widget_*,_float>::emit(&this->onValueChange,&this->super_Widget,funcArgs_1);
  Widget::requestRedraw(&this->super_Widget);
  return;
}

Assistant:

void Slider::setValue(float value) {
    float newValue = std::min(std::max(value, range_.first), range_.second);
    if (newValue != value_) {
        value_ = newValue;
        onValueChange.emit(this, newValue);
        requestRedraw();
    }
}